

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int exprNodeIsConstant(Walker *pWalker,Expr *pExpr)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  
  bVar1 = pWalker->eCode;
  if ((bVar1 != 2) || ((pExpr->flags & 1) == 0)) {
    bVar2 = pExpr->op;
    iVar3 = 0;
    if (bVar2 < 0x98) {
      if (bVar2 != 0x1b) {
        if (bVar2 == 0x87) {
          if (bVar1 != 4) {
            if (bVar1 != 5) {
              return iVar3;
            }
            pExpr->op = 'e';
            return iVar3;
          }
        }
        else {
          if (bVar2 != 0x97) {
            return iVar3;
          }
          if (3 < bVar1) {
            return iVar3;
          }
          if ((pExpr->flags & 0x80000) != 0) {
            return iVar3;
          }
        }
        goto LAB_00237210;
      }
    }
    else if (2 < bVar2 - 0x98) {
      if (bVar2 != 0xa0) {
        return iVar3;
      }
      goto LAB_00237210;
    }
    if ((bVar1 == 3) && (pExpr->iTable == (pWalker->u).n)) {
      return iVar3;
    }
  }
LAB_00237210:
  pWalker->eCode = '\0';
  return 2;
}

Assistant:

static int exprNodeIsConstant(Walker *pWalker, Expr *pExpr){

  /* If pWalker->eCode is 2 then any term of the expression that comes from
  ** the ON or USING clauses of a left join disqualifies the expression
  ** from being considered constant. */
  if( pWalker->eCode==2 && ExprHasProperty(pExpr, EP_FromJoin) ){
    pWalker->eCode = 0;
    return WRC_Abort;
  }

  switch( pExpr->op ){
    /* Consider functions to be constant if all their arguments are constant
    ** and either pWalker->eCode==4 or 5 or the function has the
    ** SQLITE_FUNC_CONST flag. */
    case TK_FUNCTION:
      if( pWalker->eCode>=4 || ExprHasProperty(pExpr,EP_ConstFunc) ){
        return WRC_Continue;
      }else{
        pWalker->eCode = 0;
        return WRC_Abort;
      }
    case TK_ID:
    case TK_COLUMN:
    case TK_AGG_FUNCTION:
    case TK_AGG_COLUMN:
      testcase( pExpr->op==TK_ID );
      testcase( pExpr->op==TK_COLUMN );
      testcase( pExpr->op==TK_AGG_FUNCTION );
      testcase( pExpr->op==TK_AGG_COLUMN );
      if( pWalker->eCode==3 && pExpr->iTable==pWalker->u.iCur ){
        return WRC_Continue;
      }
      /* Fall through */
    case TK_IF_NULL_ROW:
      testcase( pExpr->op==TK_IF_NULL_ROW );
      pWalker->eCode = 0;
      return WRC_Abort;
    case TK_VARIABLE:
      if( pWalker->eCode==5 ){
        /* Silently convert bound parameters that appear inside of CREATE
        ** statements into a NULL when parsing the CREATE statement text out
        ** of the sqlite_master table */
        pExpr->op = TK_NULL;
      }else if( pWalker->eCode==4 ){
        /* A bound parameter in a CREATE statement that originates from
        ** sqlite3_prepare() causes an error */
        pWalker->eCode = 0;
        return WRC_Abort;
      }
      /* Fall through */
    default:
      testcase( pExpr->op==TK_SELECT ); /* selectNodeIsConstant will disallow */
      testcase( pExpr->op==TK_EXISTS ); /* selectNodeIsConstant will disallow */
      return WRC_Continue;
  }
}